

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_check_small_factors(mbedtls_mpi *X)

{
  uint uVar1;
  int iVar2;
  mbedtls_mpi_uint in_RAX;
  long lVar3;
  mbedtls_mpi_uint r;
  
  iVar2 = -0xe;
  if ((*X->p & 1) != 0) {
    lVar3 = 0;
    r = in_RAX;
    while( true ) {
      if (lVar3 == 0x29c) {
        return 0;
      }
      uVar1 = *(uint *)((long)small_prime + lVar3);
      iVar2 = mbedtls_mpi_cmp_int(X,(ulong)uVar1);
      if (iVar2 < 1) break;
      iVar2 = mbedtls_mpi_mod_int(&r,X,(long)(int)uVar1);
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar3 = lVar3 + 4;
      if (r == 0) {
        return -0xe;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int mpi_check_small_factors( const mbedtls_mpi *X )
{
    int ret = 0;
    size_t i;
    mbedtls_mpi_uint r;

    if( ( X->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    for( i = 0; small_prime[i] > 0; i++ )
    {
        if( mbedtls_mpi_cmp_int( X, small_prime[i] ) <= 0 )
            return( 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, small_prime[i] ) );

        if( r == 0 )
            return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );
    }

cleanup:
    return( ret );
}